

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiGpj.cxx
# Opt level: O2

char * GhsMultiGpj::GetGpjTag(Types gpjType)

{
  if (gpjType < (CUSTOM_TARGET|LIBRARY)) {
    return GHS_TAG[gpjType];
  }
  return "";
}

Assistant:

const char* GhsMultiGpj::GetGpjTag(Types gpjType)
{
  char const* tag;
  switch (gpjType) {
    case INTERGRITY_APPLICATION:
    case LIBRARY:
    case PROJECT:
    case PROGRAM:
    case REFERENCE:
    case SUBPROJECT:
    case CUSTOM_TARGET:
      tag = GHS_TAG[gpjType];
      break;
    default:
      tag = "";
  }
  return tag;
}